

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcmp_s.c
# Opt level: O2

errno_t strcmp_s(char *dest,rsize_t dmax,char *src,int *indicator)

{
  char cVar1;
  char cVar2;
  long lVar3;
  rsize_t rVar4;
  errno_t error;
  errno_t eVar5;
  char *msg;
  long in_FS_OFFSET;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  if (indicator == (int *)0x0) {
    msg = "strcmp_s: indicator is null";
LAB_00104a99:
    eVar5 = 400;
    error = 400;
  }
  else {
    *indicator = 0;
    if (dest == (char *)0x0) {
      msg = "strcmp_s: dest is null";
      goto LAB_00104a99;
    }
    if (src == (char *)0x0) {
      msg = "strcmp_s: src is null";
      goto LAB_00104a99;
    }
    if (dmax == 0) {
      msg = "strcmp_s: dmax is 0";
      eVar5 = 0x191;
      error = 0x191;
    }
    else {
      if (dmax < 0x10000001) {
        rVar4 = 0;
        while( true ) {
          cVar1 = dest[rVar4];
          cVar2 = src[rVar4];
          if ((((cVar1 == '\0') || (cVar1 != cVar2)) || (cVar2 == '\0')) || (dmax == rVar4)) break;
          rVar4 = rVar4 + 1;
        }
        *indicator = (int)cVar1 - (int)cVar2;
        eVar5 = 0;
        goto LAB_00104aaa;
      }
      msg = "strcmp_s: dmax exceeds max";
      eVar5 = 0x193;
      error = 0x193;
    }
  }
  invoke_safe_str_constraint_handler(msg,(void *)0x0,error);
LAB_00104aaa:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return eVar5;
  }
  __stack_chk_fail();
}

Assistant:

errno_t
strcmp_s (const char *dest, rsize_t dmax,
          const char *src, int *indicator)
{
    if (indicator == NULL) {
        invoke_safe_str_constraint_handler("strcmp_s: indicator is null",
                   NULL, ESNULLP);
        return RCNEGATE(ESNULLP);
    }
    *indicator = 0;

    if (dest == NULL) {
        invoke_safe_str_constraint_handler("strcmp_s: dest is null",
                   NULL, ESNULLP);
        return RCNEGATE(ESNULLP);
    }

    if (src == NULL) {
        invoke_safe_str_constraint_handler("strcmp_s: src is null",
                   NULL, ESNULLP);
        return RCNEGATE(ESNULLP);
    }

    if (dmax == 0) {
        invoke_safe_str_constraint_handler("strcmp_s: dmax is 0",
                   NULL, ESZEROL);
        return RCNEGATE(ESZEROL);
    }

    if (dmax > RSIZE_MAX_STR) {
        invoke_safe_str_constraint_handler("strcmp_s: dmax exceeds max",
                   NULL, ESLEMAX);
        return RCNEGATE(ESLEMAX);
    }

    while (*dest && *src && dmax) {

        if (*dest != *src) {
            break;
        }

        dest++;
        src++;
        dmax--;
    }

    *indicator = *dest - *src;
    return RCNEGATE(EOK);
}